

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

intptr_t fio_accept(intptr_t srv_uuid)

{
  undefined1 *puVar1;
  char cVar2;
  undefined1 uVar3;
  fio_data_s *pfVar4;
  uint __fd;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int __fd_00;
  long lVar8;
  char *pcVar9;
  int optval;
  socklen_t size;
  socklen_t addrlen;
  sockaddr_in6 addrinfo [2];
  timespec local_88;
  socklen_t local_70 [2];
  sockaddr local_68 [3];
  
  local_70[1] = 0x38;
  __fd_00 = (int)((ulong)srv_uuid >> 8);
  __fd = accept4(__fd_00,local_68,local_70 + 1,0x80800);
  if ((int)__fd < 1) {
    uVar6 = 0xffffffffffffffff;
  }
  else {
    local_88.tv_sec._0_4_ = 1;
    setsockopt(__fd,6,1,&local_88,4);
    local_88.tv_sec = (ulong)local_88.tv_sec._4_4_ << 0x20;
    local_70[0] = 4;
    iVar5 = getsockopt(__fd,1,7,&local_88,local_70);
    if ((iVar5 == 0) && ((int)local_88.tv_sec < 0x20001)) {
      local_88.tv_sec._0_4_ = 0x20000;
      setsockopt(__fd,1,7,&local_88,4);
      local_88.tv_sec = CONCAT44(local_88.tv_sec._4_4_,0x20000);
      setsockopt(__fd,1,8,&local_88,4);
    }
    pfVar4 = fio_data;
    lVar8 = (ulong)__fd * 0xa8;
    LOCK();
    pcVar9 = (char *)((long)fio_data + lVar8 + 0x6c);
    cVar2 = *pcVar9;
    *pcVar9 = '\x01';
    UNLOCK();
    local_88.tv_sec._0_1_ = cVar2;
    if (cVar2 != '\0') {
      pcVar9 = (char *)((long)pfVar4 + lVar8 + 0x6c);
      do {
        local_88.tv_sec = 0;
        local_88.tv_nsec = 1;
        nanosleep(&local_88,(timespec *)0x0);
        LOCK();
        cVar2 = *pcVar9;
        *pcVar9 = '\x01';
        UNLOCK();
        local_88.tv_sec._0_1_ = cVar2;
      } while (cVar2 != '\0');
    }
    fio_clear_fd((ulong)__fd,'\x01');
    LOCK();
    puVar1 = (undefined1 *)((long)fio_data + lVar8 + 0x6c);
    uVar3 = *puVar1;
    *puVar1 = 0;
    pfVar4 = fio_data;
    UNLOCK();
    local_88.tv_sec = CONCAT71(local_88.tv_sec._1_7_,uVar3);
    if (local_68[0].sa_family == 1) {
      lVar7 = (long)__fd_00 * 0xa8;
      *(undefined1 *)((long)fio_data + lVar8 + 0x71) =
           *(undefined1 *)((long)fio_data + lVar7 + 0x71);
      uVar6 = (ulong)*(byte *)((long)pfVar4 + lVar7 + 0x71);
      if (uVar6 != 0) {
        memcpy((void *)((long)pfVar4 + lVar8 + 0x72),(void *)((long)pfVar4 + lVar7 + 0x72),uVar6 + 1
              );
      }
    }
    else {
      fio_tcp_addr_cpy(__fd,(uint)local_68[0].sa_family,(sockaddr *)local_68);
    }
    uVar6 = (ulong)CONCAT41(__fd,*(undefined1 *)((long)fio_data + lVar8 + 0x6d));
  }
  return uVar6;
}

Assistant:

intptr_t fio_accept(intptr_t srv_uuid) {
  struct sockaddr_in6 addrinfo[2]; /* grab a slice of stack (aligned) */
  socklen_t addrlen = sizeof(addrinfo);
  int client;
#ifdef SOCK_NONBLOCK
  client = accept4(fio_uuid2fd(srv_uuid), (struct sockaddr *)addrinfo, &addrlen,
                   SOCK_NONBLOCK | SOCK_CLOEXEC);
  if (client <= 0)
    return -1;
#else
  client = accept(fio_uuid2fd(srv_uuid), (struct sockaddr *)addrinfo, &addrlen);
  if (client <= 0)
    return -1;
  if (fio_set_non_block(client) == -1) {
    close(client);
    return -1;
  }
#endif
  // avoid the TCP delay algorithm.
  {
    int optval = 1;
    setsockopt(client, IPPROTO_TCP, TCP_NODELAY, &optval, sizeof(optval));
  }
  // handle socket buffers.
  {
    int optval = 0;
    socklen_t size = (socklen_t)sizeof(optval);
    if (!getsockopt(client, SOL_SOCKET, SO_SNDBUF, &optval, &size) &&
        optval <= 131072) {
      optval = 131072;
      setsockopt(client, SOL_SOCKET, SO_SNDBUF, &optval, sizeof(optval));
      optval = 131072;
      setsockopt(client, SOL_SOCKET, SO_RCVBUF, &optval, sizeof(optval));
    }
  }

  fio_lock(&fd_data(client).protocol_lock);
  fio_clear_fd(client, 1);
  fio_unlock(&fd_data(client).protocol_lock);
  /* copy peer address */
  if (((struct sockaddr *)addrinfo)->sa_family == AF_UNIX) {
    fd_data(client).addr_len = uuid_data(srv_uuid).addr_len;
    if (uuid_data(srv_uuid).addr_len) {
      memcpy(fd_data(client).addr, uuid_data(srv_uuid).addr,
             uuid_data(srv_uuid).addr_len + 1);
    }
  } else {
    fio_tcp_addr_cpy(client, ((struct sockaddr *)addrinfo)->sa_family,
                     (struct sockaddr *)addrinfo);
  }

  return fd2uuid(client);
}